

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_e210f::DiskInterfaceTestStatBadPath::~DiskInterfaceTestStatBadPath
          (DiskInterfaceTestStatBadPath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DiskInterfaceTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskInterfaceTest_001d2ca0;
  pcVar2 = (this->super_DiskInterfaceTest).temp_dir_.temp_dir_name_._M_dataplus._M_p;
  paVar1 = &(this->super_DiskInterfaceTest).temp_dir_.temp_dir_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_DiskInterfaceTest).temp_dir_.start_dir_._M_dataplus._M_p;
  paVar1 = &(this->super_DiskInterfaceTest).temp_dir_.start_dir_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatBadPath) {
  string err;
#ifdef _WIN32
  string bad_path("cc:\\foo");
  EXPECT_EQ(-1, disk_.Stat(bad_path, &err));
  EXPECT_NE("", err);
#else
  string too_long_name(512, 'x');
  EXPECT_EQ(-1, disk_.Stat(too_long_name, &err));
  EXPECT_NE("", err);
#endif
}